

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

void __thiscall QPDF::read_xref(QPDF *this,qpdf_offset_t xref_offset)

{
  long *plVar1;
  int __val;
  long lVar2;
  size_type sVar3;
  _Base_ptr p_Var4;
  QPDFExc *pQVar5;
  int __val_00;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var9;
  ulong uVar10;
  allocator<char> local_1f9;
  qpdf_offset_t xref_offset_local;
  string local_1f0;
  char buf [7];
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  char ch;
  string local_d0;
  string local_b0;
  set<long_long,_std::less<long_long>,_std::allocator<long_long>_> visited;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> free_table;
  
  free_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &free_table._M_t._M_impl.super__Rb_tree_header._M_header;
  free_table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  free_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  free_table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &visited._M_t._M_impl.super__Rb_tree_header._M_header;
  visited._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  visited._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  xref_offset_local = xref_offset;
  visited._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  free_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       free_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_001e11ec:
  if (xref_offset_local == 0) {
    _Var9._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    if (*(long *)&((_Var9._M_head_impl)->trailer).super_BaseHandle == 0) {
      pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ch,"",(allocator<char> *)&local_1b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,"unable to find trailer while reading xref",
                 (allocator<char> *)buf);
      damagedPDF(pQVar5,this,(string *)&ch,-1,&local_1f0);
      __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ch,"/Size",(allocator<char> *)&local_1b0);
    QPDFObjectHandle::getKey
              ((QPDFObjectHandle *)&local_1f0,(string *)&(_Var9._M_head_impl)->trailer);
    __val = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)&local_1f0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f0._M_string_length);
    std::__cxx11::string::~string((string *)&ch);
    _Var9._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    if (*(size_t *)((long)&(_Var9._M_head_impl)->xref_table + 0x28) == 0) {
      __val_00 = 0;
    }
    else {
      lVar2 = std::_Rb_tree_decrement
                        ((_Rb_tree_node_base *)((long)&(_Var9._M_head_impl)->xref_table + 8));
      __val_00 = *(int *)(lVar2 + 0x20);
    }
    if (*(size_t *)((long)&(_Var9._M_head_impl)->deleted_objects + 0x28) != 0) {
      lVar2 = std::_Rb_tree_decrement
                        ((_Rb_tree_node_base *)((long)&(_Var9._M_head_impl)->deleted_objects + 8));
      if (__val_00 <= *(int *)(lVar2 + 0x20)) {
        __val_00 = *(int *)(lVar2 + 0x20);
      }
    }
    if ((__val < 1) || (__val + -1 != __val_00)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"",&local_1f9);
      std::__cxx11::to_string(&local_b0,__val);
      std::operator+(&local_170,"reported number of objects (",&local_b0);
      std::operator+(&local_190,&local_170,") is not one plus the highest object number (");
      std::__cxx11::to_string(&local_d0,__val_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,
                     &local_190,&local_d0);
      std::operator+(&local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,")");
      damagedPDF((QPDFExc *)&ch,this,&local_1f0,-1,&local_1b0);
      warn(this,(QPDFExc *)&ch);
      QPDFExc::~QPDFExc((QPDFExc *)&ch);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)buf);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_1f0);
      _Var9._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
              (&((_Var9._M_head_impl)->deleted_objects)._M_t);
    _Var9._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    uVar6 = 0xffffffffffffffff;
    uVar10 = 0;
    for (p_Var4 = *(_Base_ptr *)((long)&(_Var9._M_head_impl)->xref_table + 0x18);
        p_Var4 != (_Rb_tree_node_base *)((long)&(_Var9._M_head_impl)->xref_table + 8U);
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      if (0 < (int)p_Var4[1]._M_color && p_Var4[1]._M_color == (_Rb_tree_color)uVar6) {
        removeObject(this,(QPDFObjGen)(uVar10 | uVar6 & 0xffffffff));
      }
      uVar6 = *(ulong *)(p_Var4 + 1);
      uVar10 = uVar6 & 0xffffffff00000000;
    }
    std::
    _Rb_tree<long_long,_long_long,_std::_Identity<long_long>,_std::less<long_long>,_std::allocator<long_long>_>
    ::~_Rb_tree(&visited._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&free_table._M_t);
    return;
  }
  std::
  _Rb_tree<long_long,long_long,std::_Identity<long_long>,std::less<long_long>,std::allocator<long_long>>
  ::_M_insert_unique<long_long_const&>
            ((_Rb_tree<long_long,long_long,std::_Identity<long_long>,std::less<long_long>,std::allocator<long_long>>
              *)&visited,&xref_offset_local);
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  plVar1 = *(long **)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  (**(code **)(*plVar1 + 0x28))(plVar1,xref_offset_local,0);
  bVar8 = false;
  do {
    bVar7 = false;
LAB_001e122c:
    if (bVar7) break;
    plVar1 = *(long **)&(((this->m)._M_t.
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                        super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
    lVar2 = (**(code **)(*plVar1 + 0x38))(plVar1,(QPDFExc *)&ch,1);
    bVar7 = true;
    if (lVar2 != 1) goto LAB_001e122c;
    if ((0x17 < (byte)(ch - 9U)) || ((0x80001fU >> ((byte)(ch - 9U) & 0x1f) & 1) == 0)) {
      plVar1 = *(long **)&(((this->m)._M_t.
                            super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                          super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar1 + 0x40))(plVar1,(int)ch);
      goto LAB_001e122c;
    }
    bVar8 = true;
  } while( true );
  plVar1 = *(long **)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  (**(code **)(*plVar1 + 0x38))(plVar1,buf,6);
  if (((buf._0_4_ == 0x66657278) && ((ulong)(byte)buf[4] < 0x21)) &&
     ((0x100003e00U >> ((ulong)(byte)buf[4] & 0x3f) & 1) != 0)) {
    if (bVar8) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,"",(allocator<char> *)&local_190);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b0,"extraneous whitespace seen before xref",
                 (allocator<char> *)&local_170);
      damagedPDF((QPDFExc *)&ch,this,&local_1f0,-1,&local_1b0);
      warn(this,(QPDFExc *)&ch);
      QPDFExc::~QPDFExc((QPDFExc *)&ch);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    lVar2 = 4;
    while (((ulong)(byte)buf[lVar2] < 0x21 &&
           ((0x100003e00U >> ((ulong)(byte)buf[lVar2] & 0x3f) & 1) != 0))) {
      lVar2 = lVar2 + 1;
    }
    xref_offset_local = read_xrefTable(this,lVar2 + xref_offset_local);
  }
  else {
    xref_offset_local = read_xrefStream(this,xref_offset_local);
  }
  sVar3 = std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::count
                    (&visited,&xref_offset_local);
  if (sVar3 != 0) {
    pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ch,"",(allocator<char> *)&local_1b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"loop detected following xref tables",
               (allocator<char> *)&local_190);
    damagedPDF(pQVar5,this,(string *)&ch,-1,&local_1f0);
    __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  goto LAB_001e11ec;
}

Assistant:

void
QPDF::read_xref(qpdf_offset_t xref_offset)
{
    std::map<int, int> free_table;
    std::set<qpdf_offset_t> visited;
    while (xref_offset) {
        visited.insert(xref_offset);
        char buf[7];
        memset(buf, 0, sizeof(buf));
        m->file->seek(xref_offset, SEEK_SET);
        // Some files miss the mark a little with startxref. We could do a better job of searching
        // in the neighborhood for something that looks like either an xref table or stream, but the
        // simple heuristic of skipping whitespace can help with the xref table case and is harmless
        // with the stream case.
        bool done = false;
        bool skipped_space = false;
        while (!done) {
            char ch;
            if (1 == m->file->read(&ch, 1)) {
                if (util::is_space(ch)) {
                    skipped_space = true;
                } else {
                    m->file->unreadCh(ch);
                    done = true;
                }
            } else {
                QTC::TC("qpdf", "QPDF eof skipping spaces before xref", skipped_space ? 0 : 1);
                done = true;
            }
        }

        m->file->read(buf, sizeof(buf) - 1);
        // The PDF spec says xref must be followed by a line terminator, but files exist in the wild
        // where it is terminated by arbitrary whitespace.
        if ((strncmp(buf, "xref", 4) == 0) && util::is_space(buf[4])) {
            if (skipped_space) {
                QTC::TC("qpdf", "QPDF xref skipped space");
                warn(damagedPDF("", -1, "extraneous whitespace seen before xref"));
            }
            QTC::TC(
                "qpdf",
                "QPDF xref space",
                ((buf[4] == '\n')       ? 0
                     : (buf[4] == '\r') ? 1
                     : (buf[4] == ' ')  ? 2
                                        : 9999));
            int skip = 4;
            // buf is null-terminated, and util::is_space('\0') is false, so this won't overrun.
            while (util::is_space(buf[skip])) {
                ++skip;
            }
            xref_offset = read_xrefTable(xref_offset + skip);
        } else {
            xref_offset = read_xrefStream(xref_offset);
        }
        if (visited.count(xref_offset) != 0) {
            QTC::TC("qpdf", "QPDF xref loop");
            throw damagedPDF("", -1, "loop detected following xref tables");
        }
    }

    if (!m->trailer) {
        throw damagedPDF("", -1, "unable to find trailer while reading xref");
    }
    int size = m->trailer.getKey("/Size").getIntValueAsInt();
    int max_obj = 0;
    if (!m->xref_table.empty()) {
        max_obj = m->xref_table.rbegin()->first.getObj();
    }
    if (!m->deleted_objects.empty()) {
        max_obj = std::max(max_obj, *(m->deleted_objects.rbegin()));
    }
    if ((size < 1) || (size - 1 != max_obj)) {
        QTC::TC("qpdf", "QPDF xref size mismatch");
        warn(damagedPDF(
            "",
            -1,
            ("reported number of objects (" + std::to_string(size) +
             ") is not one plus the highest object number (" + std::to_string(max_obj) + ")")));
    }

    // We no longer need the deleted_objects table, so go ahead and clear it out to make sure we
    // never depend on its being set.
    m->deleted_objects.clear();

    // Make sure we keep only the highest generation for any object.
    QPDFObjGen last_og{-1, 0};
    for (auto const& item: m->xref_table) {
        auto id = item.first.getObj();
        if (id == last_og.getObj() && id > 0) {
            removeObject(last_og);
        }
        last_og = item.first;
    }
}